

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

bool __thiscall spvtools::val::BasicBlock::dominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  byte local_e2;
  BasicBlock *local_e0;
  byte local_d1;
  DominatorIterator local_d0;
  byte local_a1;
  DominatorIterator local_a0;
  DominatorIterator local_78;
  byte local_49;
  DominatorIterator local_48;
  BasicBlock *local_20;
  BasicBlock *other_local;
  BasicBlock *this_local;
  
  local_49 = 0;
  local_a1 = 0;
  local_d1 = 0;
  local_e2 = 1;
  local_20 = other;
  other_local = this;
  if (this != other) {
    dom_end(&local_48,other);
    local_49 = 1;
    dom_begin(&local_a0,local_20);
    local_a1 = 1;
    dom_end(&local_d0,local_20);
    local_d1 = 1;
    local_e0 = this;
    std::find<spvtools::val::BasicBlock::DominatorIterator,spvtools::val::BasicBlock_const*>
              (&local_78,&local_a0,&local_d0,&local_e0);
    bVar1 = val::operator==(&local_48,&local_78);
    local_e2 = bVar1 ^ 0xff;
  }
  this_local._7_1_ = local_e2 & 1;
  if (this != other) {
    DominatorIterator::~DominatorIterator(&local_78);
  }
  if ((local_d1 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_d0);
  }
  if ((local_a1 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_a0);
  }
  if ((local_49 & 1) != 0) {
    DominatorIterator::~DominatorIterator(&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BasicBlock::dominates(const BasicBlock& other) const {
  return (this == &other) ||
         !(other.dom_end() ==
           std::find(other.dom_begin(), other.dom_end(), this));
}